

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::RandomUniformStaticLayerParams::ByteSizeLong
          (RandomUniformStaticLayerParams *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int64_t iVar4;
  long lVar5;
  float fVar6;
  int cached_size;
  uint32_t raw_maxval;
  float tmp_maxval;
  uint32_t raw_minval;
  float tmp_minval;
  int cached_size_1;
  size_t data_size;
  size_t sStack_30;
  uint32_t cached_has_bits;
  size_t total_size;
  RandomUniformStaticLayerParams *this_local;
  memory_order __b;
  
  sStack_30 = 0;
  sVar3 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->outputshape_);
  if (sVar3 != 0) {
    sStack_30 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar3);
    sStack_30 = sStack_30 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar3);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->_outputshape_cached_byte_size_).super___atomic_base<int>._M_i = iVar2;
  sStack_30 = sVar3 + sStack_30;
  iVar4 = _internal_seed(this);
  if (iVar4 != 0) {
    iVar4 = _internal_seed(this);
    sVar3 = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(iVar4);
    sStack_30 = sVar3 + sStack_30;
  }
  fVar6 = _internal_minval(this);
  if (fVar6 != 0.0) {
    sStack_30 = sStack_30 + 5;
  }
  fVar6 = _internal_maxval(this);
  if (fVar6 != 0.0) {
    sStack_30 = sStack_30 + 5;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    sStack_30 = lVar5 + sStack_30;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_30);
  SetCachedSize(this,iVar2);
  return sStack_30;
}

Assistant:

size_t RandomUniformStaticLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.RandomUniformStaticLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated uint64 outputShape = 4;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      UInt64Size(this->outputshape_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _outputshape_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // int64 seed = 1;
  if (this->_internal_seed() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64SizePlusOne(this->_internal_seed());
  }

  // float minVal = 2;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_minval = this->_internal_minval();
  uint32_t raw_minval;
  memcpy(&raw_minval, &tmp_minval, sizeof(tmp_minval));
  if (raw_minval != 0) {
    total_size += 1 + 4;
  }

  // float maxVal = 3;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_maxval = this->_internal_maxval();
  uint32_t raw_maxval;
  memcpy(&raw_maxval, &tmp_maxval, sizeof(tmp_maxval));
  if (raw_maxval != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}